

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_function_defaults.h
# Opt level: O2

size_t absl::lts_20250127::container_internal::
       hash_policy_traits<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,std::unique_ptr<google::protobuf::TextFormat::MessagePrinter_const,std::default_delete<google::protobuf::TextFormat::MessagePrinter_const>>>,void>
       ::
       hash_slot_fn_non_type_erased<absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash>
                 (void *hash_fn,void *slot)

{
  ulong uVar1;
  uintptr_t v;
  
  uVar1 = (*slot ^ 0x79f430) * -0x234dd359734ecb13;
  uVar1 = ((uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
            (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
            (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38) ^ *slot) * -0x234dd359734ecb13;
  return uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
         (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
         (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
}

Assistant:

size_t operator()(const U& ptr) const {
      return absl::Hash<const T*>{}(HashEq::ToPtr(ptr));
    }